

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawColumnRt4SubClampPalCommand,int,int&,int&,int&>
               (int *args,int *args_1,int *args_2,int *args_3)

{
  DrawerCommandQueue *this;
  DrawColumnRt4SubClampPalCommand *this_00;
  DrawColumnRt4SubClampPalCommand command;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    swrenderer::DrawColumnRt4SubClampPalCommand::PalRtCommand
              (&command,*args,*args_1,*args_2,*args_3);
    VectoredTryCatch(&command,QueueCommand<swrenderer::DrawColumnRt4SubClampPalCommand,_int,_int_&,_int_&,_int_&>
                              ::anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawColumnRt4SubClampPalCommand,_int,_int_&,_int_&,_int_&>
                     ::anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawColumnRt4SubClampPalCommand *)AllocMemory(0x58);
    if (this_00 == (DrawColumnRt4SubClampPalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawColumnRt4SubClampPalCommand *)AllocMemory(0x58);
      if (this_00 == (DrawColumnRt4SubClampPalCommand *)0x0) {
        return;
      }
    }
    swrenderer::DrawColumnRt4SubClampPalCommand::PalRtCommand(this_00,*args,*args_1,*args_2,*args_3)
    ;
    command.super_PalRtCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&command);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}